

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSources::CreateOwnSSRC(RTPSources *this,uint32_t ssrc)

{
  RTPInternalSourceData *this_00;
  bool bVar1;
  int iVar2;
  bool created;
  
  if (this->owndata == (RTPInternalSourceData *)0x0) {
    bVar1 = GotEntry(this,ssrc);
    if (bVar1) {
      iVar2 = -0x44;
    }
    else {
      iVar2 = ObtainSourceDataInstance(this,ssrc,&this->owndata,&created);
      if (iVar2 < 0) {
        this->owndata = (RTPInternalSourceData *)0x0;
      }
      else {
        this_00 = this->owndata;
        (this_00->super_RTPSourceData).ownssrc = true;
        (this_00->super_RTPSourceData).validated = true;
        RTPInternalSourceData::SetRTPDataAddress(this_00,(RTPAddress *)0x0);
        RTPInternalSourceData::SetRTCPDataAddress(this->owndata,(RTPAddress *)0x0);
        this->activecount = this->activecount + 1;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,this->owndata);
      }
    }
  }
  else {
    iVar2 = -0x41;
  }
  return iVar2;
}

Assistant:

int RTPSources::CreateOwnSSRC(uint32_t ssrc)
{
	if (owndata != 0)
		return ERR_RTP_SOURCES_ALREADYHAVEOWNSSRC;
	if (GotEntry(ssrc))
		return ERR_RTP_SOURCES_SSRCEXISTS;

	int status;
	bool created;
	
	status = ObtainSourceDataInstance(ssrc,&owndata,&created);
	if (status < 0)
	{
		owndata = 0; // just to make sure
		return status;
	}
	owndata->SetOwnSSRC();	
	owndata->SetRTPDataAddress(0);
	owndata->SetRTCPDataAddress(0);

	// we've created a validated ssrc, so we should increase activecount
	activecount++;

	OnNewSource(owndata);
	return 0;
}